

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

void reportPresolveReductions(HighsLogOptions *log_options,HighsLp *lp,bool presolve_to_empty)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  const_reference pvVar7;
  undefined8 uVar8;
  byte in_DL;
  uint *in_RSI;
  HighsLogOptions *in_RDI;
  string message;
  HighsInt num_els_to;
  HighsInt num_row_to;
  HighsInt num_col_to;
  HighsInt num_els_from;
  HighsInt num_row_from;
  HighsInt num_col_from;
  string local_50 [36];
  int local_2c;
  uint local_28;
  uint local_24;
  value_type local_20;
  uint local_1c;
  uint local_18;
  byte local_11;
  HighsLogOptions *local_8;
  
  local_11 = in_DL & 1;
  local_18 = *in_RSI;
  local_1c = in_RSI[1];
  local_8 = in_RDI;
  pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x24),(long)(int)local_18);
  local_20 = *pvVar7;
  std::__cxx11::string::string(local_50);
  if ((local_11 & 1) == 0) {
    local_24 = local_18;
    local_28 = local_1c;
    local_2c = local_20;
    std::__cxx11::string::operator=(local_50,"- Not reduced");
  }
  else {
    local_24 = 0;
    local_28 = 0;
    local_2c = 0;
    std::__cxx11::string::operator=(local_50,"- Reduced to empty");
  }
  uVar3 = local_24;
  uVar2 = local_28;
  iVar1 = local_2c;
  uVar4 = local_1c - local_28;
  iVar5 = local_18 - local_24;
  iVar6 = local_20 - local_2c;
  uVar8 = std::__cxx11::string::c_str();
  highsLogUser(local_8,kInfo,
               "Presolve : Reductions: rows %d(-%d); columns %d(-%d); elements %d(-%d) %s\n",
               (ulong)uVar2,(ulong)uVar4,(ulong)uVar3,iVar5,iVar1,iVar6,uVar8);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void reportPresolveReductions(const HighsLogOptions& log_options,
                              const HighsLp& lp, const bool presolve_to_empty) {
  HighsInt num_col_from = lp.num_col_;
  HighsInt num_row_from = lp.num_row_;
  HighsInt num_els_from = lp.a_matrix_.start_[num_col_from];
  HighsInt num_col_to;
  HighsInt num_row_to;
  HighsInt num_els_to;
  std::string message;
  if (presolve_to_empty) {
    num_col_to = 0;
    num_row_to = 0;
    num_els_to = 0;
    message = "- Reduced to empty";
  } else {
    num_col_to = num_col_from;
    num_row_to = num_row_from;
    num_els_to = num_els_from;
    message = "- Not reduced";
  }
  highsLogUser(log_options, HighsLogType::kInfo,
               "Presolve : Reductions: rows %" HIGHSINT_FORMAT
               "(-%" HIGHSINT_FORMAT "); columns %" HIGHSINT_FORMAT
               "(-%" HIGHSINT_FORMAT
               "); "
               "elements %" HIGHSINT_FORMAT "(-%" HIGHSINT_FORMAT ") %s\n",
               num_row_to, (num_row_from - num_row_to), num_col_to,
               (num_col_from - num_col_to), num_els_to,
               (num_els_from - num_els_to), message.c_str());
}